

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-record.c
# Opt level: O2

int big_file_write_records(BigFile *bf,BigRecordType *rtype,ptrdiff_t offset,size_t size,void *buf)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  BigBlockPtr ptr;
  BigBlock block [1];
  BigArray array [1];
  
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    if (rtype->nfield <= uVar3) {
      return 0;
    }
    ptr.fileid = 0;
    ptr._4_4_ = 0;
    ptr.roffset = 0;
    ptr.aoffset = 0;
    iVar1 = big_record_view_field(rtype,(int)uVar3,array,size,buf);
    if (iVar1 != 0) {
      iVar1 = 0xb0;
      goto LAB_0010ab25;
    }
    iVar1 = big_file_open_block(bf,block,*(char **)(rtype->fields->dtype + lVar4 + -8));
    if (iVar1 != 0) {
      iVar1 = 0xb3;
      goto LAB_0010ab25;
    }
    iVar1 = big_block_seek(block,&ptr,offset);
    if (iVar1 != 0) break;
    iVar1 = big_block_write(block,&ptr,array);
    if (iVar1 != 0) {
      iVar1 = 0xb9;
      goto LAB_0010aafb;
    }
    iVar1 = big_block_close(block);
    if (iVar1 != 0) {
      iVar1 = 0xbc;
      goto LAB_0010ab25;
    }
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x20;
  }
  iVar1 = 0xb6;
LAB_0010aafb:
  _big_file_raise((char *)0x0,
                  "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                  ,iVar1);
  iVar2 = big_block_close(block);
  iVar1 = 0xc2;
  if (iVar2 == 0) {
    return -1;
  }
LAB_0010ab25:
  _big_file_raise((char *)0x0,
                  "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                  ,iVar1);
  return -1;
}

Assistant:

int
big_file_write_records(BigFile * bf,
    const BigRecordType * rtype,
    ptrdiff_t offset,
    size_t size,
    const void * buf)
{
    int i;
    for(i = 0; i < rtype->nfield; i ++) {
        BigArray array[1];
        BigBlock block[1];
        BigBlockPtr ptr = {0};

        /* rainwoodman: cast away the const. We don't really modify it.*/
        RAISEIF(0 != big_record_view_field(rtype, i, array, size, (void*) buf),
            ex_array,
            NULL);
        RAISEIF(0 != big_file_open_block(bf, block, rtype->fields[i].name),
            ex_open,
            NULL);
        RAISEIF(0 != big_block_seek(block, &ptr, offset),
            ex_seek,
            NULL);
        RAISEIF(0 != big_block_write(block, &ptr, array),
            ex_write,
            NULL);
        RAISEIF(0 != big_block_close(block),
            ex_close,
            NULL);
        continue;
        ex_write:
        ex_seek:
            RAISEIF(0 != big_block_close(block),
            ex_close,
            NULL);
            return -1;
        ex_open:
        ex_close:
        ex_array:
            return -1;
    }
    return 0;
}